

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

int __thiscall antlr::ASTFactory::dup(ASTFactory *this,int __fd)

{
  long *plVar1;
  long *in_RDX;
  
  if (((long *)*in_RDX == (long *)0x0) || (plVar1 = *(long **)*in_RDX, plVar1 == (long *)0x0)) {
    ASTRefCount<antlr::AST>::ASTRefCount((ASTRefCount<antlr::AST> *)this,(AST *)0x0);
  }
  else {
    (**(code **)(*plVar1 + 0x18))(this);
  }
  return (int)this;
}

Assistant:

RefAST ASTFactory::dup(RefAST t)
{
	if( t )
		return t->clone();
	else
		return RefAST(nullASTptr);
}